

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsStrash.c
# Opt level: O1

Aig_Man_t * Abc_NtkAigForConstraints(Mfs_Man_t *p,Abc_Obj_t *pNode)

{
  int iVar1;
  void *pvVar2;
  Aig_Man_t *pCare;
  void *pvVar3;
  uint uVar4;
  Aig_Man_t *p_00;
  Aig_Obj_t *pAVar5;
  Vec_Ptr_t *pVVar6;
  long lVar7;
  long lVar8;
  Aig_Obj_t *local_40;
  
  if (p->pCare == (Aig_Man_t *)0x0) {
    p_00 = (Aig_Man_t *)0x0;
  }
  else {
    p_00 = Aig_ManStart(1000);
    Aig_ManIncrementTravId(p->pCare);
    pVVar6 = p->vSupp;
    if (0 < pVVar6->nSize) {
      lVar8 = 0;
      do {
        uVar4 = (uint)*(undefined8 *)((long)pVVar6->pArray[lVar8] + 0x38);
        if ((int)uVar4 < 0) goto LAB_004cb9cb;
        pVVar6 = p->pCare->vCis;
        if (pVVar6->nSize <= (int)uVar4) goto LAB_004cb9cb;
        pvVar2 = pVVar6->pArray[uVar4 & 0x7fffffff];
        *(int *)((long)pvVar2 + 0x20) = p->pCare->nTravIds;
        pAVar5 = Aig_ObjCreateCi(p_00);
        *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar5;
        lVar8 = lVar8 + 1;
        pVVar6 = p->vSupp;
      } while (lVar8 < pVVar6->nSize);
    }
    local_40 = p_00->pConst1;
    pVVar6 = p->vSupp;
    if (0 < pVVar6->nSize) {
      lVar8 = 0;
      do {
        uVar4 = (uint)*(undefined8 *)((long)pVVar6->pArray[lVar8] + 0x38);
        if (((int)uVar4 < 0) || (p->vSuppsInv->nSize <= (int)uVar4)) {
LAB_004cb9cb:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar2 = p->vSuppsInv->pArray[uVar4 & 0x7fffffff];
        if (0 < *(int *)((long)pvVar2 + 4)) {
          lVar7 = 0;
          do {
            iVar1 = *(int *)(*(long *)((long)pvVar2 + 8) + lVar7 * 4);
            if ((long)iVar1 < 0) goto LAB_004cb9cb;
            pCare = p->pCare;
            if (pCare->vCos->nSize <= iVar1) goto LAB_004cb9cb;
            pvVar3 = pCare->vCos->pArray[iVar1];
            if (*(int *)((long)pvVar3 + 0x20) != pCare->nTravIds) {
              *(int *)((long)pvVar3 + 0x20) = pCare->nTravIds;
              pAVar5 = (Aig_Obj_t *)(*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe);
              if (pCare->pConst1 != pAVar5) {
                pAVar5 = Abc_NtkConstructCare_rec(pCare,pAVar5,p_00);
                if (pAVar5 != (Aig_Obj_t *)0x0) {
                  local_40 = Aig_And(p_00,local_40,
                                     (Aig_Obj_t *)
                                     ((ulong)((uint)*(undefined8 *)((long)pvVar3 + 8) & 1) ^
                                     (ulong)pAVar5));
                }
              }
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 < *(int *)((long)pvVar2 + 4));
        }
        lVar8 = lVar8 + 1;
        pVVar6 = p->vSupp;
      } while (lVar8 < pVVar6->nSize);
    }
    Aig_ObjCreateCo(p_00,local_40);
    Aig_ManCleanup(p_00);
  }
  return p_00;
}

Assistant:

Aig_Man_t * Abc_NtkAigForConstraints( Mfs_Man_t * p, Abc_Obj_t * pNode )
{
    Abc_Obj_t * pFanin;
    Aig_Man_t * pMan;
    Aig_Obj_t * pPi, * pPo, * pObjAig, * pObjRoot;
    Vec_Int_t * vOuts;
    int i, k, iOut;
    if ( p->pCare == NULL )
        return NULL;
    pMan = Aig_ManStart( 1000 );
    // mark the care set
    Aig_ManIncrementTravId( p->pCare );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vSupp, pFanin, i )
    {
        pPi = Aig_ManCi( p->pCare, (int)(ABC_PTRUINT_T)pFanin->pData );
        Aig_ObjSetTravIdCurrent( p->pCare, pPi );
        pPi->pData = Aig_ObjCreateCi(pMan);
    }
    // construct the constraints
    pObjRoot = Aig_ManConst1(pMan);
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vSupp, pFanin, i )
    {
        vOuts = (Vec_Int_t *)Vec_PtrEntry( p->vSuppsInv, (int)(ABC_PTRUINT_T)pFanin->pData );
        Vec_IntForEachEntry( vOuts, iOut, k )
        {
            pPo = Aig_ManCo( p->pCare, iOut );
            if ( Aig_ObjIsTravIdCurrent( p->pCare, pPo ) )
                continue;
            Aig_ObjSetTravIdCurrent( p->pCare, pPo );
            if ( Aig_ObjFanin0(pPo) == Aig_ManConst1(p->pCare) )
                continue;
            pObjAig = Abc_NtkConstructCare_rec( p->pCare, Aig_ObjFanin0(pPo), pMan );
            if ( pObjAig == NULL )
                continue;
            pObjAig = Aig_NotCond( pObjAig, Aig_ObjFaninC0(pPo) );
            pObjRoot = Aig_And( pMan, pObjRoot, pObjAig );
        }
    }
    Aig_ObjCreateCo( pMan, pObjRoot );
    Aig_ManCleanup( pMan );
    return pMan;
}